

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  RepeatedField<unsigned_int> *array;
  int index;
  
  if (0 < *field) {
    puVar5 = (uint *)output->ptr;
    index = 0;
    do {
      uVar2 = md->tag;
      if (uVar2 < 0x80) {
        *(byte *)puVar5 = (byte)uVar2;
        pbVar6 = (byte *)((long)puVar5 + 1);
      }
      else {
        *(byte *)puVar5 = (byte)uVar2 | 0x80;
        if (uVar2 < 0x4000) {
          *(byte *)((long)puVar5 + 1) = (byte)(uVar2 >> 7);
          pbVar6 = (byte *)((long)puVar5 + 2);
        }
        else {
          pbVar6 = (byte *)((long)puVar5 + 2);
          uVar2 = uVar2 >> 7;
          do {
            pbVar7 = pbVar6;
            pbVar7[-1] = (byte)uVar2 | 0x80;
            uVar3 = uVar2 >> 7;
            pbVar6 = pbVar7 + 1;
            bVar1 = 0x3fff < uVar2;
            uVar2 = uVar3;
          } while (bVar1);
          *pbVar7 = (byte)uVar3;
        }
      }
      output->ptr = pbVar6;
      puVar4 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      puVar5 = (uint *)output->ptr;
      *puVar5 = *puVar4;
      puVar5 = puVar5 + 1;
      output->ptr = (uint8 *)puVar5;
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }